

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O0

int secp256k1_modinv64_mul_cmp_62
              (secp256k1_modinv64_signed62 *a,int alen,secp256k1_modinv64_signed62 *b,int64_t factor
              )

{
  secp256k1_modinv64_signed62 bm;
  secp256k1_modinv64_signed62 am;
  int i;
  long local_80 [5];
  int64_t in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  secp256k1_modinv64_signed62 *in_stack_ffffffffffffffb8;
  secp256k1_modinv64_signed62 *in_stack_ffffffffffffffc0;
  int local_2c;
  
  secp256k1_modinv64_mul_62
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
             in_stack_ffffffffffffffa8);
  secp256k1_modinv64_mul_62
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
             in_stack_ffffffffffffffa8);
  local_2c = 0;
  while( true ) {
    if (3 < local_2c) {
      local_2c = 4;
      while( true ) {
        if (local_2c < 0) {
          return 0;
        }
        if (*(long *)(&stack0xffffffffffffffa8 + (long)local_2c * 8) < local_80[local_2c]) break;
        if (local_80[local_2c] < *(long *)(&stack0xffffffffffffffa8 + (long)local_2c * 8)) {
          return 1;
        }
        local_2c = local_2c + -1;
      }
      return -1;
    }
    if (*(long *)(&stack0xffffffffffffffa8 + (long)local_2c * 8) >> 0x3e != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
              ,0x40,"test condition failed: am.v[i] >> 62 == 0");
      abort();
    }
    if (local_80[local_2c] >> 0x3e != 0) break;
    local_2c = local_2c + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/modinv64_impl.h"
          ,0x41,"test condition failed: bm.v[i] >> 62 == 0");
  abort();
}

Assistant:

static int secp256k1_modinv64_mul_cmp_62(const secp256k1_modinv64_signed62 *a, int alen, const secp256k1_modinv64_signed62 *b, int64_t factor) {
    int i;
    secp256k1_modinv64_signed62 am, bm;
    secp256k1_modinv64_mul_62(&am, a, alen, 1); /* Normalize all but the top limb of a. */
    secp256k1_modinv64_mul_62(&bm, b, 5, factor);
    for (i = 0; i < 4; ++i) {
        /* Verify that all but the top limb of a and b are normalized. */
        VERIFY_CHECK(am.v[i] >> 62 == 0);
        VERIFY_CHECK(bm.v[i] >> 62 == 0);
    }
    for (i = 4; i >= 0; --i) {
        if (am.v[i] < bm.v[i]) return -1;
        if (am.v[i] > bm.v[i]) return 1;
    }
    return 0;
}